

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddMatMult.c
# Opt level: O1

DdNode * Cudd_addMatrixMultiply(DdManager *dd,DdNode *A,DdNode *B,DdNode **z,int nz)

{
  size_t __size;
  int iVar1;
  int *vars;
  DdNode *pDVar2;
  ulong uVar3;
  
  iVar1 = dd->size;
  __size = (long)iVar1 * 4;
  vars = (int *)malloc(__size);
  if (vars == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    pDVar2 = (DdNode *)0x0;
  }
  else {
    if (0 < iVar1) {
      memset(vars,0,__size);
    }
    if (0 < nz) {
      uVar3 = 0;
      do {
        vars[z[uVar3]->index] = 1;
        uVar3 = uVar3 + 1;
      } while ((uint)nz != uVar3);
    }
    do {
      dd->reordered = 0;
      pDVar2 = addMMRecur(dd,A,B,-1,vars);
    } while (dd->reordered == 1);
    free(vars);
  }
  return pDVar2;
}

Assistant:

DdNode *
Cudd_addMatrixMultiply(
  DdManager * dd,
  DdNode * A,
  DdNode * B,
  DdNode ** z,
  int  nz)
{
    int i, nvars, *vars;
    DdNode *res; 

    /* Array vars says what variables are "summation" variables. */
    nvars = dd->size;
    vars = ABC_ALLOC(int,nvars);
    if (vars == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < nvars; i++) {
        vars[i] = 0;
    }
    for (i = 0; i < nz; i++) {
        vars[z[i]->index] = 1;
    }

    do {
        dd->reordered = 0;
        res = addMMRecur(dd,A,B,-1,vars);
    } while (dd->reordered == 1);
    ABC_FREE(vars);
    return(res);

}